

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ClientImpl::~ClientImpl(ClientImpl *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  ClientImpl *this_local;
  
  this->_vptr_ClientImpl = (_func_int **)&PTR__ClientImpl_0024b3a0;
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->socket_mutex_);
  shutdown_socket(this,&this->socket_);
  close_socket(this,&this->socket_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::~function
            (&this->logger_);
  std::__cxx11::string::~string((string *)&this->proxy_bearer_token_auth_token_);
  std::__cxx11::string::~string((string *)&this->proxy_basic_auth_password_);
  std::__cxx11::string::~string((string *)&this->proxy_basic_auth_username_);
  std::__cxx11::string::~string((string *)&this->proxy_host_);
  std::__cxx11::string::~string((string *)&this->interface_);
  std::function<void_(int)>::~function(&this->socket_options_);
  std::__cxx11::string::~string((string *)&this->bearer_token_auth_token_);
  std::__cxx11::string::~string((string *)&this->basic_auth_password_);
  std::__cxx11::string::~string((string *)&this->basic_auth_username_);
  std::__cxx11::string::~string((string *)&this->client_key_path_);
  std::__cxx11::string::~string((string *)&this->client_cert_path_);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap(&this->default_headers_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->addr_map_);
  std::__cxx11::string::~string((string *)&this->host_and_port_);
  std::__cxx11::string::~string((string *)&this->host_);
  return;
}

Assistant:

inline ClientImpl::~ClientImpl() {
  std::lock_guard<std::mutex> guard(socket_mutex_);
  shutdown_socket(socket_);
  close_socket(socket_);
}